

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

BlockDataPtr
vkt::ssbo::anon_unknown_15::getBlockDataPtr
          (BufferLayout *layout,BlockLayoutEntry *blockLayout,void *ptr,int bufferSize)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  BlockDataPtr BVar5;
  
  bVar2 = hasUnsizedArray(layout,blockLayout);
  if (bVar2) {
    iVar1 = blockLayout->size;
    iVar3 = getUnsizedArrayStride(layout,blockLayout);
    uVar4 = (long)(bufferSize - iVar1) / (long)(int)(iVar3 + (uint)(iVar3 == 0)) << 0x20;
  }
  else {
    uVar4 = 0;
  }
  BVar5._8_8_ = (uint)bufferSize | uVar4;
  BVar5.ptr = ptr;
  return BVar5;
}

Assistant:

BlockDataPtr getBlockDataPtr (const BufferLayout& layout, const BlockLayoutEntry& blockLayout, void* ptr, int bufferSize)
{
	const bool	isLastUnsized	= hasUnsizedArray(layout, blockLayout);
	const int	baseSize		= blockLayout.size;

	if (isLastUnsized)
	{
		const int		lastArrayStride	= getUnsizedArrayStride(layout, blockLayout);
		const int		lastArraySize	= (bufferSize-baseSize) / (lastArrayStride ? lastArrayStride : 1);

		DE_ASSERT(baseSize + lastArraySize*lastArrayStride == bufferSize);

		return BlockDataPtr(ptr, bufferSize, lastArraySize);
	}
	else
		return BlockDataPtr(ptr, bufferSize, 0);
}